

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteTranslational.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkRevoluteTranslational::InjectConstraints
          (ChLinkRevoluteTranslational *this,ChSystemDescriptor *descriptor)

{
  int iVar1;
  
  iVar1 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar1 != '\0') {
    (*descriptor->_vptr_ChSystemDescriptor[3])(descriptor,&this->m_cnstr_par1);
    (*descriptor->_vptr_ChSystemDescriptor[3])(descriptor,&this->m_cnstr_par2);
    (*descriptor->_vptr_ChSystemDescriptor[3])(descriptor,&this->m_cnstr_dot);
    (*descriptor->_vptr_ChSystemDescriptor[3])(descriptor,&this->m_cnstr_dist);
    return;
  }
  return;
}

Assistant:

void ChLinkRevoluteTranslational::InjectConstraints(ChSystemDescriptor& descriptor) {
    if (!IsActive())
        return;

    descriptor.InsertConstraint(&m_cnstr_par1);
    descriptor.InsertConstraint(&m_cnstr_par2);
    descriptor.InsertConstraint(&m_cnstr_dot);
    descriptor.InsertConstraint(&m_cnstr_dist);
}